

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

triplet<unsigned_short> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
::decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
           *this,triplet<unsigned_short> ra,triplet<unsigned_short> rb)

{
  default_traits<unsigned_short,_charls::triplet<unsigned_short>_> *this_00;
  array<charls::context_run_mode,_2UL> *context;
  unsigned_short uVar1;
  unsigned_short uVar2;
  uint uVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int iVar7;
  triplet<unsigned_short> tVar8;
  uint uVar9;
  uint local_40;
  
  uVar3 = rb._0_4_ >> 0x10;
  context = &this->context_run_mode_;
  iVar4 = decode_run_interruption_error(this,context->_M_elems);
  iVar5 = decode_run_interruption_error(this,context->_M_elems);
  iVar6 = decode_run_interruption_error(this,context->_M_elems);
  this_00 = &this->traits_;
  uVar9 = rb._0_4_ & 0xffff;
  local_40 = ra._0_4_;
  iVar7 = -iVar4;
  if ((local_40 & 0xffff) <= uVar9) {
    iVar7 = iVar4;
  }
  tVar8.field_0.v1 =
       default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::fix_reconstructed_value
                 (this_00,((this->traits_).near_lossless * 2 + 1) * iVar7 + uVar9);
  iVar7 = -iVar5;
  if ((ra._2_4_ & 0xffff) <= uVar3) {
    iVar7 = iVar5;
  }
  uVar1 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * iVar7 + uVar3);
  iVar7 = -iVar6;
  if ((uint)ra.field_2.v3 <= (uint)rb.field_2.v3) {
    iVar7 = iVar6;
  }
  uVar2 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * iVar7 + (uint)rb.field_2.v3);
  tVar8.field_2.v3 = uVar2;
  tVar8.field_1.v2 = uVar1;
  return tVar8;
}

Assistant:

triplet<sample_type> decode_run_interruption_pixel(triplet<sample_type> ra, triplet<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }